

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Float __thiscall pbrt::SummedAreaTable::Lookup(SummedAreaTable *this,Float x,Float y)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  Array2D<double> *in_RDI;
  float in_XMM0_Da;
  Float x_00;
  Float y_00;
  Float FVar5;
  Float FVar6;
  float in_XMM1_Da;
  Float dy;
  Float dx;
  Float v11;
  Float v01;
  Float v10;
  Float v00;
  int y0;
  int x0;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  iVar3 = Array2D<double>::XSize(in_RDI);
  fVar1 = (float)iVar3 * in_XMM0_Da;
  iVar3 = Array2D<double>::YSize(in_RDI);
  fVar2 = (float)iVar3 * in_XMM1_Da;
  iVar3 = (int)fVar1;
  iVar4 = (int)fVar2;
  x_00 = LookupInt((SummedAreaTable *)CONCAT44(iVar3,iVar4),in_stack_ffffffffffffffe4,
                   in_stack_ffffffffffffffe0);
  y_00 = LookupInt((SummedAreaTable *)CONCAT44(iVar3,iVar4),(int)x_00,in_stack_ffffffffffffffe0);
  FVar5 = LookupInt((SummedAreaTable *)CONCAT44(iVar3,iVar4),(int)x_00,(int)y_00);
  FVar6 = LookupInt((SummedAreaTable *)CONCAT44(iVar3,iVar4),(int)x_00,(int)y_00);
  fVar1 = fVar1 - (float)(int)fVar1;
  fVar2 = fVar2 - (float)(int)fVar2;
  return (1.0 - fVar1) * (1.0 - fVar2) * x_00 + (1.0 - fVar1) * fVar2 * FVar5 +
         fVar1 * (1.0 - fVar2) * y_00 + fVar1 * fVar2 * FVar6;
}

Assistant:

PBRT_CPU_GPU
    Float Lookup(Float x, Float y) const {
        // Rescale $(x,y)$ to table resolution and compute integer coordinates
        x *= sum.XSize();
        y *= sum.YSize();
        int x0 = (int)x, y0 = (int)y;

        // Bilinearly interpolate between surrounding table values
        Float v00 = LookupInt(x0, y0), v10 = LookupInt(x0 + 1, y0);
        Float v01 = LookupInt(x0, y0 + 1), v11 = LookupInt(x0 + 1, y0 + 1);
        Float dx = x - int(x), dy = y - int(y);
        return (1 - dx) * (1 - dy) * v00 + (1 - dx) * dy * v01 + dx * (1 - dy) * v10 +
               dx * dy * v11;
    }